

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

size_t Curl_ossl_version(char *buffer,size_t size)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  ulong uVar3;
  byte bVar4;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffff;
  uVar3 = OpenSSL_version_num();
  if (uVar3 < 0x906000) {
    uStack_18._0_6_ = (uint6)(uint5)uStack_18;
    uVar3 = 0x30000020;
  }
  else if ((uVar3 & 0xff0) == 0) {
    uStack_18._0_6_ = (uint6)(uint5)uStack_18;
  }
  else {
    uVar1 = (uint)(uVar3 >> 4) & 0xff;
    if (uVar1 < 0x1b) {
      bVar4 = (byte)(uVar3 >> 4) | 0x60;
    }
    else {
      uVar1 = uVar1 - 1;
      uStack_18._0_7_ =
           CONCAT16(((char)uVar1 - ((char)(uVar1 / 0x1a) * '\x19' + (char)(uVar1 / 0x1a))) + 'b',
                    (uint6)uStack_18);
      bVar4 = 0x7a;
    }
    uStack_18._0_6_ = CONCAT15(bVar4,(uint5)uStack_18);
  }
  iVar2 = curl_msnprintf(buffer,size,"%s/%lx.%lx.%lx%s","OpenSSL",uVar3 >> 0x1c & 0xf,
                         (ulong)((uint)(uVar3 >> 0x14) & 0xff),(ulong)((uint)uVar3 >> 0xc & 0xff),
                         (long)&uStack_18 + 5);
  return (long)iVar2;
}

Assistant:

size_t Curl_ossl_version(char *buffer, size_t size)
{
#ifdef OPENSSL_IS_BORINGSSL
  return snprintf(buffer, size, OSSL_PACKAGE);
#else /* OPENSSL_IS_BORINGSSL */
  char sub[3];
  unsigned long ssleay_value;
  sub[2]='\0';
  sub[1]='\0';
  ssleay_value=OpenSSL_version_num();
  if(ssleay_value < 0x906000) {
    ssleay_value=SSLEAY_VERSION_NUMBER;
    sub[0]='\0';
  }
  else {
    if(ssleay_value&0xff0) {
      int minor_ver = (ssleay_value >> 4) & 0xff;
      if(minor_ver > 26) {
        /* handle extended version introduced for 0.9.8za */
        sub[1] = (char) ((minor_ver - 1) % 26 + 'a' + 1);
        sub[0] = 'z';
      }
      else {
        sub[0] = (char) (minor_ver + 'a' - 1);
      }
    }
    else
      sub[0]='\0';
  }

  return snprintf(buffer, size, "%s/%lx.%lx.%lx%s",
                  OSSL_PACKAGE,
                  (ssleay_value>>28)&0xf,
                  (ssleay_value>>20)&0xff,
                  (ssleay_value>>12)&0xff,
                  sub);
#endif /* OPENSSL_IS_BORINGSSL */
}